

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

ecs_entity_t
assign_ptr_w_entity(ecs_world_t *world,ecs_entity_t entity,ecs_entity_t component,size_t size,
                   void *ptr,_Bool is_move,_Bool notify)

{
  ecs_move_t p_Var1;
  ecs_copy_t p_Var2;
  undefined8 stage_00;
  size_t component_00;
  ecs_entity_t world_00;
  _Bool _Var3;
  ecs_size_t eVar4;
  void *__s;
  ecs_entity_t eVar5;
  ecs_c_info_t *peVar6;
  ecs_copy_t copy;
  ecs_move_t move;
  ecs_c_info_t *cdata;
  ecs_entity_t real_id;
  void *dst;
  ecs_entity_info_t info;
  ecs_entity_t scope;
  ecs_entities_t added;
  ecs_stage_t *stage;
  _Bool notify_local;
  _Bool is_move_local;
  void *ptr_local;
  size_t size_local;
  ecs_entity_t component_local;
  ecs_entity_t entity_local;
  ecs_world_t *world_local;
  
  size_local = component;
  component_local = entity;
  entity_local = (ecs_entity_t)world;
  added._8_8_ = ecs_get_stage((ecs_world_t **)&entity_local);
  scope = (ecs_entity_t)&size_local;
  added.array._0_4_ = 1;
  if (component_local == 0) {
    component_local = ecs_new_id((ecs_world_t *)entity_local);
    info._24_8_ = *(ulong *)(added._8_8_ + 0x30);
    if (info._24_8_ != 0) {
      ecs_add_entity((ecs_world_t *)entity_local,component_local,info._24_8_ | 0xfd00000000000000);
    }
  }
  world_00 = entity_local;
  eVar5 = component_local;
  component_00 = size_local;
  stage_00 = added._8_8_;
  eVar4 = ecs_from_size_t(size);
  _Var3 = ecs_defer_set((ecs_world_t *)world_00,(ecs_stage_t *)stage_00,EcsOpSet,eVar5,component_00,
                        eVar4,ptr,(void **)0x0,(_Bool *)0x0);
  if (_Var3) {
    world_local = (ecs_world_t *)component_local;
  }
  else {
    __s = get_mutable((ecs_world_t *)entity_local,component_local,size_local,
                      (ecs_entity_info_t *)&dst,(_Bool *)0x0);
    _ecs_assert(__s != (void *)0x0,0xc,(char *)0x0,"dst != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                ,0x87a);
    if (__s == (void *)0x0) {
      __assert_fail("dst != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x87a,
                    "ecs_entity_t assign_ptr_w_entity(ecs_world_t *, ecs_entity_t, ecs_entity_t, size_t, void *, _Bool, _Bool)"
                   );
    }
    if (ptr == (void *)0x0) {
      memset(__s,0,size);
    }
    else {
      eVar5 = ecs_get_typeid((ecs_world_t *)entity_local,size_local);
      peVar6 = get_c_info((ecs_world_t *)entity_local,eVar5);
      if (peVar6 == (ecs_c_info_t *)0x0) {
        eVar4 = ecs_from_size_t(size);
        memcpy(__s,ptr,(long)eVar4);
      }
      else if (is_move) {
        p_Var1 = (peVar6->lifecycle).move;
        if (p_Var1 == (ecs_move_t)0x0) {
          eVar4 = ecs_from_size_t(size);
          memcpy(__s,ptr,(long)eVar4);
        }
        else {
          (*p_Var1)((ecs_world_t *)entity_local,eVar5,&component_local,&component_local,__s,ptr,size
                    ,1,(peVar6->lifecycle).ctx);
        }
      }
      else {
        p_Var2 = (peVar6->lifecycle).copy;
        if (p_Var2 == (ecs_copy_t)0x0) {
          eVar4 = ecs_from_size_t(size);
          memcpy(__s,ptr,(long)eVar4);
        }
        else {
          (*p_Var2)((ecs_world_t *)entity_local,eVar5,&component_local,&component_local,__s,ptr,size
                    ,1,(peVar6->lifecycle).ctx);
        }
      }
    }
    ecs_table_mark_dirty((ecs_table_t *)info.record,size_local);
    if (notify) {
      ecs_run_set_systems((ecs_world_t *)entity_local,(ecs_entities_t *)&scope,
                          (ecs_table_t *)info.record,(ecs_data_t *)info.table,(int32_t)info.data,1,
                          false);
    }
    ecs_defer_flush((ecs_world_t *)entity_local,(ecs_stage_t *)added._8_8_);
    world_local = (ecs_world_t *)component_local;
  }
  return (ecs_entity_t)world_local;
}

Assistant:

static
ecs_entity_t assign_ptr_w_entity(
    ecs_world_t *world,
    ecs_entity_t entity,
    ecs_entity_t component,
    size_t size,
    void * ptr,
    bool is_move,
    bool notify)
{
    ecs_stage_t *stage = ecs_get_stage(&world);

    ecs_entities_t added = {
        .array = &component,
        .count = 1
    };

    if (!entity) {
        entity = ecs_new_id(world);
        ecs_entity_t scope = stage->scope;
        if (scope) {
            ecs_add_entity(world, entity, ECS_CHILDOF | scope);
        }
    }

    if (ecs_defer_set(world, stage, EcsOpSet, entity, component, 
        ecs_from_size_t(size), ptr, NULL, NULL))
    {
        return entity;
    }

    ecs_entity_info_t info;

    void *dst = get_mutable(world, entity, component, &info, NULL);

    /* This can no longer happen since we defer operations */
    ecs_assert(dst != NULL, ECS_INTERNAL_ERROR, NULL);

    if (ptr) {
        ecs_entity_t real_id = ecs_get_typeid(world, component);
        ecs_c_info_t *cdata = get_c_info(world, real_id);
        if (cdata) {
            if (is_move) {
                ecs_move_t move = cdata->lifecycle.move;
                if (move) {
                    move(world, real_id, &entity, &entity, dst, ptr, size, 1, 
                        cdata->lifecycle.ctx);
                } else {
                    ecs_os_memcpy(dst, ptr, ecs_from_size_t(size));
                }
            } else {
                ecs_copy_t copy = cdata->lifecycle.copy;
                if (copy) {
                    copy(world, real_id, &entity, &entity, dst, ptr, size, 1, 
                        cdata->lifecycle.ctx);
                } else {
                    ecs_os_memcpy(dst, ptr, ecs_from_size_t(size));
                }
            }
        } else {
            ecs_os_memcpy(dst, ptr, ecs_from_size_t(size));
        }
    } else {
        memset(dst, 0, size);
    }

    ecs_table_mark_dirty(info.table, component);

    if (notify) {
        ecs_run_set_systems(world, &added, 
            info.table, info.data, info.row, 1, false);
    }

    ecs_defer_flush(world, stage);

    return entity;
}